

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Skeleton::drawGhost(Skeleton *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Mesh *pMVar10;
  int dummy;
  int local_c;
  
  pMVar10 = this->mesh;
  dVar1 = (pMVar10->super_SceneObject).rotation.x;
  dVar2 = (pMVar10->super_SceneObject).rotation.y;
  dVar3 = (pMVar10->super_SceneObject).rotation.z;
  dVar4 = (pMVar10->super_SceneObject).position.x;
  dVar5 = (pMVar10->super_SceneObject).scale.x;
  dVar6 = (pMVar10->super_SceneObject).position.y;
  dVar7 = (pMVar10->super_SceneObject).scale.y;
  dVar8 = (pMVar10->super_SceneObject).position.z;
  dVar9 = (pMVar10->super_SceneObject).scale.z;
  glPushMatrix();
  glTranslated(dVar4,dVar6,dVar8);
  glRotatef((float)dVar1,0x3f800000,0,0);
  glRotatef((float)dVar2,0,0x3f800000,0);
  glRotatef((float)dVar3,0,0,0x3f800000);
  glScalef((float)dVar5,(float)dVar7,(float)dVar9);
  drawJoint(this,this->root,&local_c,false);
  drawCapsule(this,this->root);
  glPopMatrix();
  return;
}

Assistant:

void Skeleton::drawGhost()
  {
    Vector3D meshPos = mesh->position;
    Vector3D meshRot = mesh->rotation;
    Vector3D meshScale = mesh->scale;
    int dummy; // not used when pickMode is false, but required

    glPushMatrix();
      glTranslated(meshPos.x, meshPos.y, meshPos.z);
      glRotatef(meshRot.x, 1.0f, 0.0f, 0.0f);
      glRotatef(meshRot.y, 0.0f, 1.0f, 0.0f);
      glRotatef(meshRot.z, 0.0f, 0.0f, 1.0f);
      glScalef(meshScale.x, meshScale.y, meshScale.z);

      drawJoint(root,dummy);
      drawCapsule(root);

    glPopMatrix();
  }